

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O3

void __thiscall randomx::JitCompilerX86::h_ISTORE(JitCompilerX86 *this,Instruction *instr,int i)

{
  uint8_t *puVar1;
  int iVar2;
  
  genAddressRegDst(this,instr);
  puVar1 = this->code;
  iVar2 = this->codePos;
  (puVar1 + iVar2)[0] = 'L';
  (puVar1 + iVar2)[1] = 0x89;
  iVar2 = this->codePos + 2;
  this->codePos = iVar2;
  this->code[iVar2] = instr->src << 3 | 4;
  iVar2 = this->codePos;
  this->codePos = iVar2 + 1;
  this->code[(long)iVar2 + 1] = '\x06';
  this->codePos = this->codePos + 1;
  return;
}

Assistant:

void JitCompilerX86::h_ISTORE(Instruction& instr, int i) {
		genAddressRegDst(instr);
		emit(REX_MOV_MR);
		emitByte(0x04 + 8 * instr.src);
		emitByte(0x06);
	}